

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.c
# Opt level: O1

void TestSuite_Integer(void)

{
  sysbvm_context_t *psVar1;
  sysbvm_context_t *psVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  char *pcVar7;
  
  sysbvm_test_currentTestCaseName = "Negation";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Negation...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-0");
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:15: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_negated(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:16: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_negated(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:18: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_negated(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:19: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_negated(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:21: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar5 = sysbvm_integer_negated(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:22: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "Addition";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Addition...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:28: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:29: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:30: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:33: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:36: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"49");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"42");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:37: Obtained value is not equal to INTEGER(\"49\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:40: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar5 = sysbvm_integer_add(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:41: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "Subtraction";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Subtraction...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:47: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:48: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:50: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:53: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-35");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"42");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:54: Obtained value is not equal to INTEGER(\"-35\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"5");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:56: Obtained value is not equal to INTEGER(\"5\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"5");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:57: Obtained value is not equal to INTEGER(\"5\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_subtract(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:58: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "Multiplication";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Multiplication...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:64: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:65: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:66: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:67: Obtained value is not equal to INTEGER(\"3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:68: Obtained value is not equal to INTEGER(\"3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:69: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:70: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:71: Obtained value is not equal to INTEGER(\"-3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:72: Obtained value is not equal to INTEGER(\"-3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:75: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:76: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:77: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:78: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:81: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:82: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:83: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:84: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:85: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:88: Obtained value is not equal to INTEGER(\"6\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"49");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar5 = sysbvm_integer_multiply(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:89: Obtained value is not equal to INTEGER(\"49\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "Division";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Division...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:95: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:96: Obtained value is not equal to INTEGER(\"3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:97: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-3");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:98: Obtained value is not equal to INTEGER(\"-3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:101: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:102: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:103: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:104: Obtained value is not equal to INTEGER(\"0\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:107: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:108: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:109: Obtained value is not equal to INTEGER(\"-1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"-2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:110: Obtained value is not equal to INTEGER(\"-2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:113: Obtained value is not equal to INTEGER(\"3\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:114: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"49");
  sVar6 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar5 = sysbvm_integer_divide(psVar2,sVar5,sVar6);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:115: Obtained value is not equal to INTEGER(\"7\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "Factorial";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- Factorial...");
  TuuvmCore_initialize();
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:120: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:121: Obtained value is not equal to INTEGER(\"1\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:122: Obtained value is not equal to INTEGER(\"2\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:123: Obtained value is not equal to INTEGER(\"6\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"24");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"4");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:124: Obtained value is not equal to INTEGER(\"24\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"120");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"5");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:125: Obtained value is not equal to INTEGER(\"120\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"720");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:126: Obtained value is not equal to INTEGER(\"720\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"5040");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:127: Obtained value is not equal to INTEGER(\"5040\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"40320");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"8");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:128: Obtained value is not equal to INTEGER(\"40320\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"362880");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"9");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:129: Obtained value is not equal to INTEGER(\"362880\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"3628800");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"10");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:130: Obtained value is not equal to INTEGER(\"3628800\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"2432902008176640000");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"20");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:132: Obtained value is not equal to INTEGER(\"2432902008176640000\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString(sysbvm_test_context,"265252859812191058636308480000000");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"30");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:133: Obtained value is not equal to INTEGER(\"265252859812191058636308480000000\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString
                    (sysbvm_test_context,"815915283247897734345611269596115894272000000000");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"40");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:134: Obtained value is not equal to INTEGER(\"815915283247897734345611269596115894272000000000\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString
                    (sysbvm_test_context,
                     "30414093201713378043612608166064768844377641568960512000000000000");
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"50");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:135: Obtained value is not equal to INTEGER(\"30414093201713378043612608166064768844377641568960512000000000000\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  psVar1 = sysbvm_test_context;
  sVar4 = sysbvm_integer_parseCString
                    (sysbvm_test_context,
                     "93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000"
                    );
  psVar2 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"100");
  sVar5 = sysbvm_integer_factorial(psVar2,sVar5);
  _Var3 = sysbvm_integer_equals(psVar1,sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:136: Obtained value is not equal to INTEGER(\"93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000\")"
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "AsHexString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- AsHexString...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"0");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:141: Obtained value is not equal to \"0\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:142: Obtained value is not equal to \"1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"-1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:143: Obtained value is not equal to \"-1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"A");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"10");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:144: Obtained value is not equal to \"A\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"2A");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"42");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:145: Obtained value is not equal to \"2A\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"1E240");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"123456");
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:146: Obtained value is not equal to \"1E240\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"21C3677C82B40000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"20");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:148: Obtained value is not equal to \"21C3677C82B40000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"D13F6370F96865DF5DD54000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"30");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:149: Obtained value is not equal to \"D13F6370F96865DF5DD54000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,"8EEAE81B84C7F27E080FDE64FF05254000000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"40");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:150: Obtained value is not equal to \"8EEAE81B84C7F27E080FDE64FF05254000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,"49EEBC961ED279B02B1EF4F28D19A84F5973A1D2C7800000000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"50");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:151: Obtained value is not equal to \"49EEBC961ED279B02B1EF4F28D19A84F5973A1D2C7800000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,
                     "1B30964EC395DC24069528D54BBDA40D16E966EF9A70EB21B5B2943A321CDF10391745570CCA9420C6ECB3B72ED2EE8B02EA2735C61A000000000000000000000000"
                    );
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"100");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:152: Obtained value is not equal to \"1B30964EC395DC24069528D54BBDA40D16E966EF9A70EB21B5B2943A321CDF10391745570CCA9420C6ECB3B72ED2EE8B02EA2735C61A000000000000000000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,
                     "29A857090114875BA4DB6CD48EB197FFCAF0730BC388499A8C0E87E9854C253EEB306EF59E33ECC0F352847EAAE8691E58A9BEB434E84A9D68FBAB85E3270936F66CD32B2009B4948A51C096C970FD7F3E208773A39A9BD13A95CA25CE6EDF52F45A0A019B4431524593E57012C03AD01E8372C59E8A8ADF4C076D40B09CB04C48AEC2A0000000000000000000000000000000000000000000000000"
                    );
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"200");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_integer_toHexString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:153: Obtained value is not equal to \"29A857090114875BA4DB6CD48EB197FFCAF0730BC388499A8C0E87E9854C253EEB306EF59E33ECC0F352847EAAE8691E58A9BEB434E84A9D68FBAB85E3270936F66CD32B2009B4948A51C096C970FD7F3E208773A39A9BD13A95CA25CE6EDF52F45A0A019B4431524593E57012C03AD01E8372C59E8A8ADF4C076D40B09CB04C48AEC2A0000000000000000000000000000000000000000000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  sysbvm_test_currentTestCaseName = "AsString";
  sysbvm_test_currentHasError = 0;
  sysbvm_test_runCount = sysbvm_test_runCount + 1;
  printf("---- AsString...");
  TuuvmCore_initialize();
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"0");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:158: Obtained value is not equal to \"0\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:159: Obtained value is not equal to \"1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"-1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"-1");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:160: Obtained value is not equal to \"-1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"10");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"10");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:161: Obtained value is not equal to \"10\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"42");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"42");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:162: Obtained value is not equal to \"42\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"123456");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"123456");
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:163: Obtained value is not equal to \"123456\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"0");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:165: Obtained value is not equal to \"1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"1");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"1");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:166: Obtained value is not equal to \"1\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"2");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"2");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:167: Obtained value is not equal to \"2\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"6");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"3");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:168: Obtained value is not equal to \"6\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"24");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"4");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:169: Obtained value is not equal to \"24\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"120");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"5");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:170: Obtained value is not equal to \"120\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"720");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"6");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:171: Obtained value is not equal to \"720\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"5040");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"7");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:172: Obtained value is not equal to \"5040\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"40320");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"8");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:173: Obtained value is not equal to \"40320\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"362880");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"9");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:174: Obtained value is not equal to \"362880\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"3628800");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"10");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:175: Obtained value is not equal to \"3628800\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"2432902008176640000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"20");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:177: Obtained value is not equal to \"2432902008176640000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString(sysbvm_test_context,"265252859812191058636308480000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"30");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:178: Obtained value is not equal to \"265252859812191058636308480000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,"815915283247897734345611269596115894272000000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"40");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:179: Obtained value is not equal to \"815915283247897734345611269596115894272000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,
                     "30414093201713378043612608166064768844377641568960512000000000000");
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"50");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:180: Obtained value is not equal to \"30414093201713378043612608166064768844377641568960512000000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  sVar4 = sysbvm_string_createWithCString
                    (sysbvm_test_context,
                     "93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000"
                    );
  psVar1 = sysbvm_test_context;
  sVar5 = sysbvm_integer_parseCString(sysbvm_test_context,"100");
  sVar5 = sysbvm_integer_factorial(psVar1,sVar5);
  sVar5 = sysbvm_tuple_asString(psVar1,sVar5);
  _Var3 = sysbvm_string_equals(sVar4,sVar5);
  if (!_Var3) {
    if (sysbvm_test_currentHasError == 0) {
      putchar(10);
    }
    puts(
        "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/tests/sysbvm/Integer.c:181: Obtained value is not equal to \"93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000\""
        );
    if (sysbvm_test_currentHasError == 0) {
      sysbvm_test_errorCount = sysbvm_test_errorCount + 1;
      sysbvm_test_currentHasError = 1;
    }
  }
  TuuvmCore_shutdown();
  pcVar7 = "";
  if (sysbvm_test_currentHasError == 0) {
    pcVar7 = " Success\n";
  }
  printf(pcVar7);
  return;
}

Assistant:

TEST_SUITE(Integer)
{
    TEST_CASE_WITH_FIXTURE(Negation, TuuvmCore)
    {
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), INTEGER("-0"));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_negated(sysbvm_test_context, INTEGER("0")));

        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_negated(sysbvm_test_context, INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_negated(sysbvm_test_context, INTEGER("-1")));

        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_negated(sysbvm_test_context, INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_negated(sysbvm_test_context, INTEGER("-2")));
    }

    TEST_CASE_WITH_FIXTURE(Addition, TuuvmCore)
    {
        // Neutral element
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_add(sysbvm_test_context, INTEGER("0"), INTEGER("0")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_add(sysbvm_test_context, INTEGER("0"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_add(sysbvm_test_context, INTEGER("1"), INTEGER("0")));

        // Cancellation
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_add(sysbvm_test_context, INTEGER("-1"), INTEGER("1")));

        // Simple sums
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_add(sysbvm_test_context, INTEGER("1"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("49"), sysbvm_integer_add(sysbvm_test_context, INTEGER("7"), INTEGER("42")));

        // Differing sign sums
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_add(sysbvm_test_context, INTEGER("2"), INTEGER("-3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_add(sysbvm_test_context, INTEGER("3"), INTEGER("-2")));
    }

    TEST_CASE_WITH_FIXTURE(Subtraction, TuuvmCore)
    {
        // Neutral element
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("0"), INTEGER("0")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("1"), INTEGER("0")));

        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("0"), INTEGER("1")));

        // Simple subtractions
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("1"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-35"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("7"), INTEGER("42")));

        TEST_ASSERT_INTEGER_EQUALS(INTEGER("5"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("2"), INTEGER("-3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("5"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("3"), INTEGER("-2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_subtract(sysbvm_test_context, INTEGER("-1"), INTEGER("1")));
    }

    TEST_CASE_WITH_FIXTURE(Multiplication, TuuvmCore)
    {
        // Neutral element
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("2"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("3"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("3"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("3"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("-2"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("-2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-3"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("-3"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-3"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("-3")));

        // Absorbing element
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("0"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("0")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("0"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("0")));

        // Negation
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("-1"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("1"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("-1"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("-1"), INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("2"), INTEGER("-1")));

        // Simple multiplications.
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("6"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("2"), INTEGER("3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("49"), sysbvm_integer_multiply(sysbvm_test_context, INTEGER("7"), INTEGER("7")));
    }

    TEST_CASE_WITH_FIXTURE(Division, TuuvmCore)
    {
        // Neutral element
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("2"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("3"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("3"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("-2"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-3"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("-3"), INTEGER("1")));

        // Division from zero
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("0"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("0"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("0"), INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("0"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("0"), INTEGER("-2")));

        // Negation
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("-1"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("-1"), INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-1"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("1"), INTEGER("-1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("-2"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("2"), INTEGER("-1")));

        // Simple divisions
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("3"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("6"), INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("6"), INTEGER("3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("7"), sysbvm_integer_divide(sysbvm_test_context, INTEGER("49"), INTEGER("7")));
    }

    TEST_CASE_WITH_FIXTURE(Factorial, TuuvmCore)
    {
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("0")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("1"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("1")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("2")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("6"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("3")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("24"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("4")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("120"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("5")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("720"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("6")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("5040"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("7")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("40320"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("8")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("362880"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("9")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("3628800"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("10")));

        TEST_ASSERT_INTEGER_EQUALS(INTEGER("2432902008176640000"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("20")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("265252859812191058636308480000000"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("30")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("815915283247897734345611269596115894272000000000"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("40")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("30414093201713378043612608166064768844377641568960512000000000000"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("50")));
        TEST_ASSERT_INTEGER_EQUALS(INTEGER("93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000"), sysbvm_integer_factorial(sysbvm_test_context, INTEGER("100")));
    }

    TEST_CASE_WITH_FIXTURE(AsHexString, TuuvmCore)
    {
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("0", INTEGER("0"));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("1", INTEGER("1"));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("-1", INTEGER("-1"));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("A", INTEGER("10"));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("2A", INTEGER("42"));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("1E240", INTEGER("123456"));

        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("21C3677C82B40000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("20")));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("D13F6370F96865DF5DD54000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("30")));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("8EEAE81B84C7F27E080FDE64FF05254000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("40")));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("49EEBC961ED279B02B1EF4F28D19A84F5973A1D2C7800000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("50")));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("1B30964EC395DC24069528D54BBDA40D16E966EF9A70EB21B5B2943A321CDF10391745570CCA9420C6ECB3B72ED2EE8B02EA2735C61A000000000000000000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("100")));
        TEST_ASSERT_INTEGER_HEXSTRING_EQUALS("29A857090114875BA4DB6CD48EB197FFCAF0730BC388499A8C0E87E9854C253EEB306EF59E33ECC0F352847EAAE8691E58A9BEB434E84A9D68FBAB85E3270936F66CD32B2009B4948A51C096C970FD7F3E208773A39A9BD13A95CA25CE6EDF52F45A0A019B4431524593E57012C03AD01E8372C59E8A8ADF4C076D40B09CB04C48AEC2A0000000000000000000000000000000000000000000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("200")));
    }

    TEST_CASE_WITH_FIXTURE(AsString, TuuvmCore)
    {
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("0", INTEGER("0"));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("1", INTEGER("1"));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("-1", INTEGER("-1"));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("10", INTEGER("10"));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("42", INTEGER("42"));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("123456", INTEGER("123456"));

        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("1", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("0")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("1", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("1")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("2", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("2")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("6", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("3")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("24", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("4")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("120", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("5")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("720", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("6")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("5040", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("7")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("40320", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("8")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("362880", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("9")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("3628800", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("10")));

        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("2432902008176640000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("20")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("265252859812191058636308480000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("30")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("815915283247897734345611269596115894272000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("40")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("30414093201713378043612608166064768844377641568960512000000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("50")));
        TEST_ASSERT_INTEGER_TOSTRING_EQUALS("93326215443944152681699238856266700490715968264381621468592963895217599993229915608941463976156518286253697920827223758251185210916864000000000000000000000000", sysbvm_integer_factorial(sysbvm_test_context, INTEGER("100")));
    }
}